

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
write_int_noinline<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,
          write_int_arg<unsigned_int> arg,basic_format_specs<char16_t> *specs,locale_ref loc)

{
  presentation_type pVar1;
  size_t sVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  char *digits;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar6;
  char *pcVar7;
  byte *pbVar8;
  char *pcVar9;
  ulong uVar10;
  write_int_arg<unsigned_int> wVar11;
  char16_t *pcVar12;
  buffer<char16_t> *buf;
  ulong uVar13;
  int size;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  format_decimal_result<char16_t_*> fVar19;
  char16_t buffer [10];
  write_int_data<char16_t> data;
  byte local_79;
  undefined1 local_78 [32];
  bool local_58;
  write_int_data<char16_t> local_48;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_38;
  
  pVar1 = specs->type;
  local_38.container = out.container;
  if (pVar1 < string) {
    uVar18 = (ulong)arg >> 0x20;
    uVar17 = arg.prefix;
    uVar14 = arg.abs_value;
    switch(pVar1) {
    case none:
    case dec:
      uVar13 = (ulong)arg & 0xffffffff;
      if (((specs->field_0xa & 1) != 0) &&
         (bVar3 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long,char16_t>
                            (&local_38,uVar13,uVar17,specs,loc), bVar3)) {
        return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)local_38.container;
      }
      bVar6.container = local_38.container;
      uVar15 = 0x1f;
      if ((uVar14 | 1) != 0) {
        for (; (uVar14 | 1) >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      uVar16 = *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar15 * 8) + uVar13;
      size = (int)(uVar16 >> 0x20);
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char16_t>::write_int_data(&local_48,size,uVar17,specs);
        local_78._8_8_ = local_48.size;
        local_78._16_8_ = local_48.padding;
        local_78._24_8_ = uVar16 & 0xffffffff00000000 | uVar13;
        local_78._0_4_ = uVar17;
        bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                          (bVar6,specs,local_48.size,local_48.size,
                           (anon_class_32_3_03e05ccd *)local_78);
        return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar6.container;
      }
      if (-1 < (long)uVar16) {
        if ((uVar18 != 0) && (((ulong)arg & 0xffffff00000000) != 0)) {
          uVar18 = (local_38.container)->size_;
          uVar17 = uVar17 & 0xffffff;
          do {
            uVar13 = uVar18 + 1;
            uVar16 = uVar18;
            uVar18 = uVar13;
            if ((bVar6.container)->capacity_ < uVar13) {
              (**(bVar6.container)->_vptr_buffer)(bVar6.container);
              uVar16 = (bVar6.container)->size_;
              uVar18 = uVar16 + 1;
            }
            (bVar6.container)->size_ = uVar18;
            (bVar6.container)->ptr_[uVar16] = (ushort)uVar17 & 0xff;
            bVar3 = 0xff < uVar17;
            uVar17 = uVar17 >> 8;
          } while (bVar3);
        }
        fVar19 = format_decimal<char16_t,unsigned_int>((char16_t *)local_78,uVar14,size);
        bVar6 = copy_str_noinline<char16_t,char16_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                          ((char16_t *)local_78,fVar19.end,bVar6);
        return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar6.container;
      }
      fmt::v8::detail::assert_fail
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                 ,0x195,"negative value");
    case oct:
      uVar15 = 0x1f;
      if ((uVar14 | 1) != 0) {
        for (; (uVar14 | 1) >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      uVar15 = uVar15 & 0xff;
      bVar4 = (char)(uVar15 * 0x56 >> 8) + 1;
      uVar13 = (ulong)bVar4;
      if (((specs->field_0x9 & 0x80) != 0) && (uVar14 != 0 && specs->precision <= (int)(uint)bVar4))
      {
        uVar14 = 0x3000;
        if (uVar18 == 0) {
          uVar14 = 0x30;
        }
        uVar18 = (ulong)((uVar14 | uVar17) + 0x1000000);
      }
      uVar14 = (uint)uVar18;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char16_t>::write_int_data(&local_48,(uint)bVar4,uVar14,specs);
        local_78._8_8_ = local_48.size;
        local_78._16_8_ = local_48.padding;
        local_78._24_8_ = (ulong)arg & 0xffffffff | uVar13 << 0x20;
        local_78._0_4_ = uVar14;
        bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_4_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_4_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                          (out,specs,local_48.size,local_48.size,
                           (anon_class_32_3_03e05ccd *)local_78);
        return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar6.container;
      }
      if ((uVar14 != 0) && ((uVar18 & 0xffffff) != 0)) {
        uVar18 = (out.container)->size_;
        uVar14 = uVar14 & 0xffffff;
        do {
          uVar16 = uVar18 + 1;
          uVar10 = uVar18;
          uVar18 = uVar16;
          if ((out.container)->capacity_ < uVar16) {
            (**(out.container)->_vptr_buffer)(out.container);
            uVar10 = (out.container)->size_;
            uVar18 = uVar10 + 1;
          }
          (out.container)->size_ = uVar18;
          (out.container)->ptr_[uVar10] = (ushort)uVar14 & 0xff;
          bVar3 = 0xff < uVar14;
          uVar14 = uVar14 >> 8;
        } while (bVar3);
      }
      sVar2 = (out.container)->size_;
      uVar18 = sVar2 + uVar13;
      if (uVar18 <= (out.container)->capacity_) {
        (out.container)->size_ = uVar18;
        if ((out.container)->ptr_ != (char16_t *)0x0) {
          pcVar12 = (out.container)->ptr_ + sVar2 + (ulong)uVar15 / 3;
          wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
          do {
            uVar14 = arg.abs_value;
            *pcVar12 = (ushort)arg.abs_value & 7 | 0x30;
            wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 3);
            pcVar12 = pcVar12 + -1;
            arg = wVar11;
          } while (7 < uVar14);
          return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out.container;
        }
      }
      pcVar7 = local_78 + uVar13;
      pbVar8 = local_78 + (ulong)uVar15 / 3;
      wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar14 = arg.abs_value;
        *pbVar8 = (byte)arg.abs_value & 7 | 0x30;
        wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 3);
        pbVar8 = pbVar8 + -1;
        arg = wVar11;
      } while (7 < uVar14);
      break;
    case hex_lower:
    case hex_upper:
      local_79 = pVar1 == hex_upper;
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar5 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
        uVar15 = uVar5 << 8;
        if (uVar18 == 0) {
          uVar15 = uVar5;
        }
        uVar18 = (ulong)((uVar15 | uVar17) + 0x2000000);
      }
      uVar17 = 0x1f;
      if ((uVar14 | 1) != 0) {
        for (; (uVar14 | 1) >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      uVar14 = 8 - ((uVar17 ^ 0x1c) >> 2);
      uVar13 = (ulong)uVar14;
      uVar17 = (uint)uVar18;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char16_t>::write_int_data(&local_48,uVar14,uVar17,specs);
        local_78._8_8_ = local_48.size;
        local_78._16_8_ = local_48.padding;
        local_78._24_8_ = (ulong)arg & 0xffffffff | uVar13 << 0x20;
        local_58 = (bool)local_79;
        local_78._0_4_ = uVar17;
        bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_2_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_2_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                          (out,specs,local_48.size,local_48.size,
                           (anon_class_40_3_03e05ccd *)local_78);
        return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar6.container;
      }
      if ((uVar17 != 0) && ((uVar18 & 0xffffff) != 0)) {
        uVar18 = (out.container)->size_;
        uVar14 = uVar17 & 0xffffff;
        do {
          uVar16 = uVar18 + 1;
          uVar10 = uVar18;
          uVar18 = uVar16;
          if ((out.container)->capacity_ < uVar16) {
            (**(out.container)->_vptr_buffer)(out.container);
            uVar10 = (out.container)->size_;
            uVar18 = uVar10 + 1;
          }
          (out.container)->size_ = uVar18;
          (out.container)->ptr_[uVar10] = (ushort)uVar14 & 0xff;
          bVar3 = 0xff < uVar14;
          uVar14 = uVar14 >> 8;
        } while (bVar3);
      }
      sVar2 = (out.container)->size_;
      uVar18 = sVar2 + uVar13;
      if (uVar18 <= (out.container)->capacity_) {
        (out.container)->size_ = uVar18;
        if ((out.container)->ptr_ != (char16_t *)0x0) {
          pcVar7 = "0123456789abcdef";
          if (pVar1 == hex_upper) {
            pcVar7 = "0123456789ABCDEF";
          }
          pcVar12 = (out.container)->ptr_ + uVar13 + sVar2;
          wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
          do {
            pcVar12 = pcVar12 + -1;
            uVar14 = arg.abs_value;
            *pcVar12 = (short)pcVar7[uVar14 & 0xf];
            wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 4);
            arg = wVar11;
          } while (0xf < uVar14);
          return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out.container;
        }
      }
      pcVar7 = local_78 + uVar13;
      pcVar9 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar9 = "0123456789ABCDEF";
      }
      pbVar8 = &local_79 + uVar13;
      wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar14 = arg.abs_value;
        *pbVar8 = pcVar9[uVar14 & 0xf];
        wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 4);
        pbVar8 = pbVar8 + -1;
        arg = wVar11;
      } while (0xf < uVar14);
      break;
    case bin_lower:
    case bin_upper:
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar5 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
        uVar15 = uVar5 << 8;
        if (uVar18 == 0) {
          uVar15 = uVar5;
        }
        uVar18 = (ulong)((uVar15 | uVar17) + 0x2000000);
      }
      uVar17 = 0x1f;
      if ((uVar14 | 1) != 0) {
        for (; (uVar14 | 1) >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      uVar14 = (uVar17 ^ 0xffffffe0) + 0x21;
      uVar13 = (ulong)uVar14;
      uVar17 = (uint)uVar18;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char16_t>::write_int_data(&local_48,uVar14,uVar17,specs);
        local_78._8_8_ = local_48.size;
        local_78._16_8_ = local_48.padding;
        local_78._24_8_ = (ulong)arg & 0xffffffff | uVar13 << 0x20;
        local_78._0_4_ = uVar17;
        bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_3_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_3_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                          (out,specs,local_48.size,local_48.size,
                           (anon_class_32_3_03e05ccd *)local_78);
        return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar6.container;
      }
      if ((uVar17 != 0) && ((uVar18 & 0xffffff) != 0)) {
        uVar18 = (out.container)->size_;
        uVar14 = uVar17 & 0xffffff;
        do {
          uVar16 = uVar18 + 1;
          uVar10 = uVar18;
          uVar18 = uVar16;
          if ((out.container)->capacity_ < uVar16) {
            (**(out.container)->_vptr_buffer)(out.container);
            uVar10 = (out.container)->size_;
            uVar18 = uVar10 + 1;
          }
          (out.container)->size_ = uVar18;
          (out.container)->ptr_[uVar10] = (ushort)uVar14 & 0xff;
          bVar3 = 0xff < uVar14;
          uVar14 = uVar14 >> 8;
        } while (bVar3);
      }
      sVar2 = (out.container)->size_;
      uVar18 = sVar2 + uVar13;
      if (uVar18 <= (out.container)->capacity_) {
        (out.container)->size_ = uVar18;
        if ((out.container)->ptr_ != (char16_t *)0x0) {
          pcVar12 = (out.container)->ptr_ + uVar13 + sVar2;
          wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
          do {
            pcVar12 = pcVar12 + -1;
            uVar14 = arg.abs_value;
            *pcVar12 = (ushort)arg.abs_value & 1 | 0x30;
            wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 1);
            arg = wVar11;
          } while (1 < uVar14);
          return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out.container;
        }
      }
      pcVar7 = local_78 + uVar13;
      pbVar8 = &local_79 + uVar13;
      wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar14 = arg.abs_value;
        *pbVar8 = (byte)arg.abs_value & 1 | 0x30;
        wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 1);
        pbVar8 = pbVar8 + -1;
        arg = wVar11;
      } while (1 < uVar14);
      break;
    default:
      goto switchD_0015f7a5_caseD_7;
    case chr:
      local_78._0_2_ = (short)arg.abs_value;
      bVar6 = write_padded<(fmt::v8::align::type)1,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_char<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::basic_format_specs<char16_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                        (out,specs,1,1,(anon_class_2_1_a8c68091 *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar6.container;
    }
    bVar6 = copy_str_noinline<char16_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                      (local_78,pcVar7,out);
    return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar6.container;
  }
switchD_0015f7a5_caseD_7:
  fmt::v8::detail::throw_format_error("invalid type specifier");
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}